

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mapper.cpp
# Opt level: O1

bool __thiscall
Mapper::canMapLabel(Mapper *this,string *label,uint instructionIndex,
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                   *labelMap,
                   vector<AssemberInstruction,_std::allocator<AssemberInstruction>_> *instructions)

{
  ulong uVar1;
  bool bVar2;
  iterator iVar3;
  ulong uVar4;
  uint *puVar5;
  int iVar6;
  undefined1 auVar7 [12];
  
  iVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&labelMap->_M_h,label);
  if (iVar3.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
      ._M_cur == (__node_type *)0x0) {
    auVar7 = std::__throw_out_of_range("_Map_base::at");
    if (auVar7._8_4_ != 1) {
      _Unwind_Resume();
    }
    canMapLabel(auVar7._0_8_);
    bVar2 = false;
  }
  else {
    uVar1 = *(ulong *)((long)iVar3.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                             ._M_cur + 0x28);
    bVar2 = true;
    if (uVar1 != instructionIndex) {
      if (instructionIndex < uVar1) {
        uVar4 = (ulong)(int)instructionIndex;
        if (uVar4 < uVar1) {
          puVar5 = &(instructions->
                    super__Vector_base<AssemberInstruction,_std::allocator<AssemberInstruction>_>).
                    _M_impl.super__Vector_impl_data._M_start[uVar4].length;
          do {
            uVar4 = uVar4 + 1;
            bVar2 = *puVar5 != 0;
            if (*puVar5 == 0) {
              return bVar2;
            }
            puVar5 = puVar5 + 0x10;
          } while (uVar4 < uVar1);
        }
      }
      else {
        iVar6 = instructionIndex - 1;
        do {
          uVar4 = (ulong)iVar6;
          bVar2 = iVar6 < 1 || uVar4 < uVar1;
          if (bVar2) {
            return bVar2;
          }
          iVar6 = iVar6 + -1;
        } while ((instructions->
                 super__Vector_base<AssemberInstruction,_std::allocator<AssemberInstruction>_>).
                 _M_impl.super__Vector_impl_data._M_start[uVar4].length != 0);
      }
    }
  }
  return bVar2;
}

Assistant:

bool Mapper::canMapLabel(std::string label, unsigned int instructionIndex, std::unordered_map<std::string, size_t> labelMap,
	std::vector<AssemberInstruction> instructions) {

	size_t labelIndex;
	try {
		labelIndex = labelMap.at(label);
	}
	catch (std::out_of_range) {
		return false;
	}
	if (labelIndex == instructionIndex) {
		return true;
	}
	if (labelIndex > instructionIndex) {
		for (int i = instructionIndex; i < labelIndex; i++) {
			if (!instructions[i].length) {
				return false;
			}
		}
	}
	else {
		for (int i = instructionIndex - 1; i >= labelIndex && i > 0; i--) {
			if (!instructions[i].length) {
				return false;
			}
			if (i == 0)
				return true;
		}
	}
	return true;
}